

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions<google::protobuf::FieldDescriptor>
          (DescriptorBuilder *this,Proto *proto,FieldDescriptor *descriptor,int options_field_tag,
          string_view option_name,FlatAllocator *alloc)

{
  Span<const_int> options_path_00;
  DescriptorStringView psVar1;
  FeatureSet *pFVar2;
  pointer local_98;
  size_type sStack_90;
  string_view local_88;
  string_view local_78;
  OptionsType *local_68;
  OptionsType *options;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> options_path;
  int options_field_tag_local;
  FieldDescriptor *descriptor_local;
  Proto *proto_local;
  DescriptorBuilder *this_local;
  string_view option_name_local;
  
  options_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = options_field_tag;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
  FieldDescriptor::GetLocationPath(descriptor,(vector<int,_std::allocator<int>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_50,
             (value_type_conflict3 *)
             ((long)&options_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  psVar1 = FieldDescriptor::full_name_abi_cxx11_(descriptor);
  local_78 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1)
  ;
  psVar1 = FieldDescriptor::full_name_abi_cxx11_(descriptor);
  local_88 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1)
  ;
  absl::lts_20240722::Span<int_const>::
  Span<std::vector<int,std::allocator<int>>,void,std::vector<int,std::allocator<int>>,int>
            ((Span<int_const> *)&local_98,(vector<int,_std::allocator<int>_> *)local_50);
  options_path_00.len_ = sStack_90;
  options_path_00.ptr_ = local_98;
  local_68 = AllocateOptionsImpl<google::protobuf::FieldDescriptor>
                       (this,local_78,local_88,proto,options_path_00,option_name,alloc);
  descriptor->options_ = local_68;
  pFVar2 = FeatureSet::default_instance();
  descriptor->proto_features_ = pFVar2;
  pFVar2 = FeatureSet::default_instance();
  descriptor->merged_features_ = pFVar2;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(
    const typename DescriptorT::Proto& proto, DescriptorT* descriptor,
    int options_field_tag, absl::string_view option_name,
    internal::FlatAllocator& alloc) {
  std::vector<int> options_path;
  descriptor->GetLocationPath(&options_path);
  options_path.push_back(options_field_tag);
  auto options = AllocateOptionsImpl<DescriptorT>(
      descriptor->full_name(), descriptor->full_name(), proto, options_path,
      option_name, alloc);
  descriptor->options_ = options;
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();
}